

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ReduceProdLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reduceprod(NeuralNetworkLayer *this)

{
  ReduceProdLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x4fb) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4fb;
    this_00 = (ReduceProdLayerParams *)operator_new(0x30);
    ReduceProdLayerParams::ReduceProdLayerParams(this_00);
    (this->layer_).reduceprod_ = this_00;
  }
  return (ReduceProdLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceProdLayerParams* NeuralNetworkLayer::mutable_reduceprod() {
  if (!has_reduceprod()) {
    clear_layer();
    set_has_reduceprod();
    layer_.reduceprod_ = new ::CoreML::Specification::ReduceProdLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceProd)
  return layer_.reduceprod_;
}